

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall
BoardView::DrawDiamond(BoardView *this,ImDrawList *draw,ImVec2 c,double r,uint32_t color)

{
  ImVec2 dia [4];
  
  dia[0].x = c.x;
  dia[1].y = c.y;
  dia[0].y = (float)((double)dia[1].y - r);
  dia[1].x = (float)((double)dia[0].x + r);
  dia[2].y = (float)((double)dia[1].y + r);
  dia[3].x = (float)((double)dia[0].x - r);
  dia[2].x = dia[0].x;
  dia[3].y = dia[1].y;
  ImDrawList::AddPolyline(draw,dia,4,color,1,1.0);
  return;
}

Assistant:

void BoardView::DrawDiamond(ImDrawList *draw, ImVec2 c, double r, uint32_t color) {
	ImVec2 dia[4];

	dia[0] = ImVec2(c.x, c.y - r);
	dia[1] = ImVec2(c.x + r, c.y);
	dia[2] = ImVec2(c.x, c.y + r);
	dia[3] = ImVec2(c.x - r, c.y);

	draw->AddPolyline(dia, 4, color, true, 1.0f);
}